

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNextFollowingSibling(void)

{
  int iVar1;
  int iVar2;
  xmlNodePtr val;
  xmlNodePtr val_00;
  uint local_34;
  int n_cur;
  xmlNodePtr cur;
  int n_ctxt;
  xmlXPathParserContextPtr ctxt;
  xmlNodePtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (cur._4_4_ = 0; (int)cur._4_4_ < 1; cur._4_4_ = cur._4_4_ + 1) {
    for (local_34 = 0; (int)local_34 < 3; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlNodePtr(local_34,1);
      val_00 = (xmlNodePtr)xmlXPathNextFollowingSibling(0,val);
      desret_xmlNodePtr(val_00);
      call_tests = call_tests + 1;
      des_xmlNodePtr(local_34,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNextFollowingSibling",
               (ulong)(uint)(iVar2 - iVar1));
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)cur._4_4_);
        printf(" %d",(ulong)local_34);
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlXPathNextFollowingSibling(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodePtr ret_val;
    xmlXPathParserContextPtr ctxt; /* the XPath Parser context */
    int n_ctxt;
    xmlNodePtr cur; /* the current node in the traversal */
    int n_cur;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlXPathParserContextPtr;n_ctxt++) {
    for (n_cur = 0;n_cur < gen_nb_xmlNodePtr;n_cur++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlXPathParserContextPtr(n_ctxt, 0);
        cur = gen_xmlNodePtr(n_cur, 1);

        ret_val = xmlXPathNextFollowingSibling(ctxt, cur);
        desret_xmlNodePtr(ret_val);
        call_tests++;
        des_xmlXPathParserContextPtr(n_ctxt, ctxt, 0);
        des_xmlNodePtr(n_cur, cur, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNextFollowingSibling",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_cur);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}